

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Option<unsigned_long> * Catch::list(Option<unsigned_long> *__return_storage_ptr__,Config *config)

{
  size_t sVar1;
  _func_void *p_Var2;
  
  __return_storage_ptr__->nullableValue = (unsigned_long *)0x0;
  if ((config->m_data).listTests == true) {
    sVar1 = listTests(config);
    (__return_storage_ptr__->field_1).dummy4 = sVar1;
    __return_storage_ptr__->nullableValue = (unsigned_long *)&__return_storage_ptr__->field_1;
    if ((config->m_data).listTestNamesOnly != false) {
      p_Var2 = (__return_storage_ptr__->field_1).dummy2;
LAB_001291d1:
      sVar1 = listTestsNamesOnly(config);
      (__return_storage_ptr__->field_1).dummy2 = p_Var2 + sVar1;
      __return_storage_ptr__->nullableValue = (unsigned_long *)&__return_storage_ptr__->field_1;
    }
    if ((config->m_data).listTags != false) {
      p_Var2 = (__return_storage_ptr__->field_1).dummy2;
      goto LAB_001291fd;
    }
  }
  else {
    if ((config->m_data).listTestNamesOnly != false) {
      p_Var2 = (_func_void *)0x0;
      goto LAB_001291d1;
    }
    if ((config->m_data).listTags == false) {
      if ((config->m_data).listReporters == false) {
        return __return_storage_ptr__;
      }
      p_Var2 = (_func_void *)0x0;
      goto LAB_0012921d;
    }
    p_Var2 = (_func_void *)0x0;
LAB_001291fd:
    sVar1 = listTags(config);
    (__return_storage_ptr__->field_1).dummy2 = p_Var2 + sVar1;
    __return_storage_ptr__->nullableValue = (unsigned_long *)&__return_storage_ptr__->field_1;
  }
  if ((config->m_data).listReporters == false) {
    return __return_storage_ptr__;
  }
  p_Var2 = (__return_storage_ptr__->field_1).dummy2;
LAB_0012921d:
  sVar1 = listReporters(config);
  (__return_storage_ptr__->field_1).dummy2 = p_Var2 + sVar1;
  __return_storage_ptr__->nullableValue = (unsigned_long *)&__return_storage_ptr__->field_1;
  return __return_storage_ptr__;
}

Assistant:

inline Option<std::size_t> list( Config const& config ) {
        Option<std::size_t> listedCount;
        if( config.listTests() )
            listedCount = listedCount.valueOr(0) + listTests( config );
        if( config.listTestNamesOnly() )
            listedCount = listedCount.valueOr(0) + listTestsNamesOnly( config );
        if( config.listTags() )
            listedCount = listedCount.valueOr(0) + listTags( config );
        if( config.listReporters() )
            listedCount = listedCount.valueOr(0) + listReporters( config );
        return listedCount;
    }